

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O1

string * qpModelStatusToString_abi_cxx11_
                   (string *__return_storage_ptr__,QpModelStatus qp_model_status)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(qp_model_status) {
  case kNotset:
    pcVar2 = "Not set";
    pcVar1 = "";
    break;
  case kUndetermined:
    pcVar2 = "Undetermined";
    pcVar1 = "";
    break;
  case kOptimal:
    pcVar2 = "Optimal";
    pcVar1 = "";
    break;
  case kUnbounded:
    pcVar2 = "Unbounded";
    pcVar1 = "";
    break;
  case kInfeasible:
    pcVar2 = "Infeasible";
    pcVar1 = "";
    break;
  case kIterationLimit:
    pcVar2 = "Iteration limit";
    pcVar1 = "";
    break;
  case kTimeLimit:
    pcVar2 = "Time ;limit";
    pcVar1 = "";
    break;
  case kLargeNullspace:
    pcVar2 = "Large nullspace";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unidentified QP model status";
    pcVar1 = "";
    break;
  case kError:
    pcVar2 = "Error";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string qpModelStatusToString(const QpModelStatus qp_model_status) {
  switch (qp_model_status) {
    case QpModelStatus::kNotset:
      return "Not set";
    case QpModelStatus::kUndetermined:
      return "Undetermined";
    case QpModelStatus::kOptimal:
      return "Optimal";
    case QpModelStatus::kUnbounded:
      return "Unbounded";
    case QpModelStatus::kInfeasible:
      return "Infeasible";
    case QpModelStatus::kIterationLimit:
      return "Iteration limit";
    case QpModelStatus::kTimeLimit:
      return "Time ;limit";
    case QpModelStatus::kLargeNullspace:
      return "Large nullspace";
    case QpModelStatus::kError:
      return "Error";
    default:
      return "Unidentified QP model status";
  }
}